

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  PositionType *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  PointerType pSVar3;
  PointerType pcVar4;
  allocator local_61;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_SOURCE_DIR","");
  pcVar2 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)local_40,pcVar2,&local_61);
  this_00 = &this->Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Vars);
  cmDefinitions::Set(pcVar4,&local_60,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  pcVar2 = cmState::GetSourceDirectory(this->State);
  std::__cxx11::string::string((string *)local_40,pcVar2,&local_61);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Vars);
  cmDefinitions::Set(pcVar4,&local_60,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_BINARY_DIR","");
  pcVar2 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)local_40,pcVar2,&local_61);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Vars);
  cmDefinitions::Set(pcVar4,&local_60,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  pcVar2 = cmState::GetBinaryDirectory(this->State);
  std::__cxx11::string::string((string *)local_40,pcVar2,&local_61);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar3->Vars);
  cmDefinitions::Set(pcVar4,&local_60,(char *)local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}